

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O3

ComplexPair * __thiscall
Iir::BandPassTransform::transform
          (ComplexPair *__return_storage_ptr__,BandPassTransform *this,complex_t c)

{
  double in_XMM0_Qa;
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  double in_XMM1_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  if (INFINITY <= in_XMM0_Qa) {
    dVar6 = 0.0;
    if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) {
      *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value =
           0xbff0000000000000;
      uVar1 = 0x3ff0000000000000;
      local_38 = 0.0;
      goto LAB_0010408f;
    }
  }
  local_30 = (double)__divdc3(in_XMM0_Qa + 1.0,in_XMM1_Qa,1.0 - in_XMM0_Qa,-in_XMM1_Qa,
                              __return_storage_ptr__,this,c._M_value._0_8_,c._M_value._8_8_);
  dVar6 = (this->a2 + -1.0) * this->b2;
  dVar7 = (dVar6 + 1.0) * 4.0;
  local_38 = dVar7 * in_XMM1_Qa + 0.0;
  local_40 = (dVar6 + -1.0) * 8.0 + local_30 * dVar7 + 0.0;
  local_28 = in_XMM1_Qa;
  std::complex<double>::operator*=((complex<double> *)&local_40,(complex<double> *)&local_30);
  local_40 = ((this->a2 + -1.0) * this->b2 + 1.0) * 4.0 + local_40;
  dVar2 = csqrt(local_40);
  dVar7 = this->ab_2;
  local_40 = dVar7 * local_30 + dVar2 + dVar7;
  dVar6 = dVar7 * local_28 - local_38;
  local_38 = dVar7 * local_28 + local_38;
  dVar4 = this->b + -1.0;
  dVar4 = dVar4 + dVar4;
  dVar5 = dVar4 * local_28 + 0.0;
  dVar8 = this->b + 1.0;
  dVar4 = dVar8 + dVar8 + local_30 * dVar4 + 0.0;
  uVar3 = __divdc3((dVar7 * local_30 - dVar2) + dVar7,dVar6,dVar4,dVar5);
  uVar1 = __divdc3(local_40,local_38,dVar4,dVar5);
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = uVar3;
LAB_0010408f:
  *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar6;
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value = uVar1;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = local_38;
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandPassTransform::transform (complex_t c)
{
	if (c == infinity())
		return ComplexPair (-1, 1);
	
	c = (1. + c) / (1. - c); // bilinear
	
	complex_t v = 0;
	v = addmul (v, 4 * (b2 * (a2 - 1) + 1), c);
	v += 8 * (b2 * (a2 - 1) - 1);
	v *= c;
	v += 4 * (b2 * (a2 - 1) + 1);
	v = std::sqrt (v);
	
	complex_t u = -v;
	u = addmul (u, ab_2, c);
	u += ab_2;
	
	v = addmul (v, ab_2, c);
	v += ab_2;
	
	complex_t d = 0;
	d = addmul (d, 2 * (b - 1), c) + 2 * (1 + b);
	
	return ComplexPair (u/d, v/d);
}